

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O0

int __thiscall
jrtplib::RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
DeleteCurrentElement
          (RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317> *this)

{
  HashElement *pHVar1;
  HashElement *pHVar2;
  int iVar3;
  RTPMemoryManager *mgr;
  int index;
  HashElement *tmp2;
  HashElement *tmp1;
  RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317> *this_local;
  
  if (this->curhashelem == (HashElement *)0x0) {
    this_local._4_4_ = -7;
  }
  else {
    iVar3 = HashElement::GetHashIndex(this->curhashelem);
    pHVar1 = this->curhashelem->hashprev;
    pHVar2 = this->curhashelem->hashnext;
    if (pHVar1 == (HashElement *)0x0) {
      this->table[iVar3] = pHVar2;
      if (pHVar2 != (HashElement *)0x0) {
        pHVar2->hashprev = (HashElement *)0x0;
      }
    }
    else {
      pHVar1->hashnext = pHVar2;
      if (pHVar2 != (HashElement *)0x0) {
        pHVar2->hashprev = pHVar1;
      }
    }
    pHVar1 = this->curhashelem->listprev;
    pHVar2 = this->curhashelem->listnext;
    if (pHVar1 == (HashElement *)0x0) {
      this->firsthashelem = pHVar2;
      if (pHVar2 == (HashElement *)0x0) {
        this->lasthashelem = (HashElement *)0x0;
      }
      else {
        pHVar2->listprev = (HashElement *)0x0;
      }
    }
    else {
      pHVar1->listnext = pHVar2;
      if (pHVar2 == (HashElement *)0x0) {
        this->lasthashelem = pHVar1;
      }
      else {
        pHVar2->listprev = pHVar1;
      }
    }
    pHVar1 = this->curhashelem;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPHashTable<in6_addr_const,jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,8317>::HashElement>
              (pHVar1,mgr);
    this->curhashelem = pHVar2;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::DeleteCurrentElement()
{
	if (curhashelem)
	{
		HashElement *tmp1,*tmp2;
		int index;
		
		// First, relink elements in current hash bucket
		
		index = curhashelem->GetHashIndex();
		tmp1 = curhashelem->hashprev;
		tmp2 = curhashelem->hashnext;
		if (tmp1 == 0) // no previous element in hash bucket
		{
			table[index] = tmp2;
			if (tmp2 != 0)
				tmp2->hashprev = 0;
		}
		else // there is a previous element in the hash bucket
		{
			tmp1->hashnext = tmp2;
			if (tmp2 != 0)
				tmp2->hashprev = tmp1;
		}

		// Relink elements in list
		
		tmp1 = curhashelem->listprev;
		tmp2 = curhashelem->listnext;
		if (tmp1 == 0) // curhashelem is first in list
		{
			firsthashelem = tmp2;
			if (tmp2 != 0)
				tmp2->listprev = 0;
			else // curhashelem is also last in list
				lasthashelem = 0;	
		}
		else
		{
			tmp1->listnext = tmp2;
			if (tmp2 != 0)
				tmp2->listprev = tmp1;
			else // curhashelem is last in list
				lasthashelem = tmp1;
		}
		
		// finally, with everything being relinked, we can delete curhashelem
		RTPDelete(curhashelem,GetMemoryManager());
		curhashelem = tmp2; // Set to next element in the list
	}
	else
		return ERR_RTP_HASHTABLE_NOCURRENTELEMENT;
	return 0;
}